

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

double ov_time_tell(OggVorbis_File *vf)

{
  long lVar1;
  ogg_int64_t oVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  if (vf->ready_state < 2) {
    return -131.0;
  }
  if (vf->seekable == 0) {
    dVar6 = 0.0;
    lVar5 = 0;
    oVar2 = 0;
  }
  else {
    oVar2 = ov_pcm_total(vf,-1);
    dVar6 = ov_time_total(vf,-1);
    iVar3 = vf->links;
    uVar4 = iVar3 * 2;
    lVar1 = (long)(iVar3 + -1);
    do {
      lVar5 = lVar1;
      uVar4 = uVar4 - 2;
      if (iVar3 < 1) break;
      oVar2 = oVar2 - *(long *)((long)vf->pcmlengths + ((ulong)uVar4 << 3 | 8));
      dVar7 = ov_time_total(vf,(int)lVar5);
      dVar6 = dVar6 - dVar7;
      iVar3 = iVar3 + -1;
      lVar1 = lVar5 + -1;
    } while (vf->pcm_offset < oVar2);
  }
  return (double)(vf->pcm_offset - oVar2) / (double)vf->vi[lVar5].rate + dVar6;
}

Assistant:

double ov_time_tell(OggVorbis_File *vf){
  int link=0;
  ogg_int64_t pcm_total=0;
  double time_total=0.f;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(vf->seekable){
    pcm_total=ov_pcm_total(vf,-1);
    time_total=ov_time_total(vf,-1);

    /* which bitstream section does this time offset occur in? */
    for(link=vf->links-1;link>=0;link--){
      pcm_total-=vf->pcmlengths[link*2+1];
      time_total-=ov_time_total(vf,link);
      if(vf->pcm_offset>=pcm_total)break;
    }
  }

  return((double)time_total+(double)(vf->pcm_offset-pcm_total)/vf->vi[link].rate);
}